

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpoint_set.c
# Opt level: O0

int mpt_fpoint_set(mpt_fpoint *pt,mpt_convertable *src,mpt_range *r)

{
  mpt_fpoint mVar1;
  mpt_fpoint mVar2;
  int iVar3;
  int local_3c;
  int type;
  int ret;
  mpt_fpoint tmp;
  mpt_iterator *it;
  mpt_range *r_local;
  mpt_convertable *src_local;
  mpt_fpoint *pt_local;
  
  memset(&type,0,8);
  if (src == (mpt_convertable *)0x0) {
    mVar1.y = (float)ret;
    mVar1.x = (float)type;
    *pt = mVar1;
    pt_local._4_4_ = 0;
  }
  else {
    tmp.x = 0.0;
    tmp.y = 0.0;
    iVar3 = (*src->_vptr->convert)(src,0x86,&tmp);
    if (iVar3 < 0) {
      iVar3 = mpt_fpoint_typeid();
      if ((iVar3 < 1) || (local_3c = (*src->_vptr->convert)(src,(long)iVar3,&type), local_3c < 0)) {
        return -3;
      }
    }
    else {
      iVar3 = mpt_iterator_consume(tmp,0x66,&type);
      if (iVar3 < 0) {
        return iVar3;
      }
      if (iVar3 == 0) {
        local_3c = 1;
        ret = type;
      }
      else {
        iVar3 = mpt_iterator_consume(tmp,0x66,&ret);
        if (iVar3 < 0) {
          return iVar3;
        }
        local_3c = 2;
      }
    }
    if ((r == (mpt_range *)0x0) ||
       ((((r->min <= (double)(float)type && (r->min <= (double)(float)ret)) &&
         ((double)(float)type < r->max || (double)(float)type == r->max)) &&
        ((double)(float)ret < r->max || (double)(float)ret == r->max)))) {
      mVar2.y = (float)ret;
      mVar2.x = (float)type;
      *pt = mVar2;
      pt_local._4_4_ = local_3c;
    }
    else {
      pt_local._4_4_ = -2;
    }
  }
  return pt_local._4_4_;
}

Assistant:

extern int mpt_fpoint_set(MPT_STRUCT(fpoint) *pt, MPT_INTERFACE(convertable) *src, const MPT_STRUCT(range) *r)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(fpoint) tmp = { 0.0, 0.0 };
	int ret;
	
	if (!src) {
		*pt = tmp;
		return 0;
	}
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) < 0) {
		int type = mpt_fpoint_typeid();
		if (type <= 0 || (ret = src->_vptr->convert(src, type, &tmp)) < 0) {
			return MPT_ERROR(BadType);
		}
	}
	else {
		/* first coordinate */
		if ((ret = mpt_iterator_consume(it, 'f', &tmp.x)) < 0) {
			return ret;
		}
		if (!ret) {
			ret = 1;
			tmp.y = tmp.x;
		}
		else if ((ret = mpt_iterator_consume(it, 'f', &tmp.y)) < 0) {
			return ret;
		}
		else {
			ret = 2;
		}
	}
	if (r) {
		if (tmp.x < r->min || tmp.y < r->min
		 || tmp.x > r->max || tmp.y > r->max) {
			return MPT_ERROR(BadValue);
		}
	}
	*pt = tmp;
	return ret;
}